

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

MatrixXd * ChebTools::Schur_matrixT(MatrixXd *__return_storage_ptr__,MatrixXd *A,bool balance)

{
  DenseStorage<double,__1,__1,__1,_0> *other;
  undefined7 in_register_00000011;
  MatrixXd Abalanced;
  MatrixXd D;
  IdentityReturnType local_c0;
  RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> schur;
  
  Eigen::RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::RealSchur(&schur,1);
  if ((int)CONCAT71(in_register_00000011,balance) == 0) {
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
              ((IdentityReturnType *)&Abalanced,
               (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows,(A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols);
    Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    computeFromHessenberg<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&schur,A,
               (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)&Abalanced,false);
  }
  else {
    Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)0x0;
    D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
    D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
    balance_matrix(A,&Abalanced,&D);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity
              (&local_c0,
               (A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows,(A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols);
    Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    computeFromHessenberg<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&schur,&Abalanced,&local_c0,false);
    free(D.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    free(Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
        );
  }
  other = (DenseStorage<double,__1,__1,__1,_0> *)
          Eigen::RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixT(&schur);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)__return_storage_ptr__,other);
  Eigen::RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~RealSchur(&schur);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Schur_matrixT(const Eigen::MatrixXd &A, bool balance){
        Eigen::RealSchur<Eigen::MatrixXd> schur;
        if (balance) {
            Eigen::MatrixXd Abalanced, D;
            balance_matrix(A, Abalanced, D);
            schur.computeFromHessenberg(Abalanced, Eigen::MatrixXd::Identity(A.rows(), A.cols()), false);
        }
        else {
            schur.computeFromHessenberg(A, Eigen::MatrixXd::Identity(A.rows(), A.cols()), false);
        }
        
        return schur.matrixT();
    }